

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

CallExprBuilder __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginCall
          (BasicExprFactory<std::allocator<char>_> *this,Function func,int num_args)

{
  AssertionFailure *this_00;
  BasicIteratedExprBuilder<mp::CallExpr> BVar1;
  CallExprBuilder CVar2;
  
  if (func.impl_ != (Impl *)0x0) {
    BVar1 = BeginIterated<mp::CallExpr>(this,CALL,num_args);
    (BVar1.impl_)->func = func.impl_;
    CVar2.impl_ = BVar1.impl_;
    CVar2.arg_index_ = BVar1.arg_index_;
    CVar2._12_4_ = BVar1._12_4_;
    return CVar2;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid function");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

operator SafeBool() const { return impl_ != 0 ? &Function::True : 0; }